

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SPIRExtension * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRExtension>::
allocate<spirv_cross::SPIRExtension::Extension&>
          (ObjectPool<spirv_cross::SPIRExtension> *this,Extension *p)

{
  Vector<spirv_cross::SPIRExtension_*> *this_00;
  Extension EVar1;
  SPIRExtension *pSVar2;
  size_t sVar3;
  ulong count;
  bool bVar4;
  SPIRExtension *ptr;
  SPIRExtension *local_40;
  SPIRExtension *local_38;
  
  this_00 = &this->vacants;
  sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRExtension_*>.buffer_size;
  if (sVar3 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRExtension,_spirv_cross::ObjectPool<spirv_cross::SPIRExtension>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    pSVar2 = (SPIRExtension *)malloc(count << 4);
    if (pSVar2 == (SPIRExtension *)0x0) {
      return (SPIRExtension *)0x0;
    }
    local_38 = pSVar2;
    SmallVector<spirv_cross::SPIRExtension_*,_0UL>::reserve(this_00,count);
    while (bVar4 = count != 0, count = count - 1, bVar4) {
      local_40 = pSVar2;
      SmallVector<spirv_cross::SPIRExtension_*,_0UL>::push_back(this_00,&local_40);
      pSVar2 = pSVar2 + 1;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRExtension,spirv_cross::ObjectPool<spirv_cross::SPIRExtension>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRExtension*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRExtension,spirv_cross::ObjectPool<spirv_cross::SPIRExtension>::MallocDeleter>,8ul>
                *)&this->memory,&local_38);
    sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRExtension_*>.buffer_size;
  }
  pSVar2 = (this_00->super_VectorView<spirv_cross::SPIRExtension_*>).ptr[sVar3 - 1];
  SmallVector<spirv_cross::SPIRExtension_*,_0UL>::pop_back(this_00);
  EVar1 = *p;
  (pSVar2->super_IVariant).self.id = 0;
  (pSVar2->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_004ea618;
  *(Extension *)&(pSVar2->super_IVariant).field_0xc = EVar1;
  return pSVar2;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}